

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack11.cpp
# Opt level: O0

void __thiscall msgpack11::MsgPack::MsgPack(MsgPack *this,double value)

{
  shared_ptr<msgpack11::MsgPackDouble> local_28;
  double local_18;
  double value_local;
  MsgPack *this_local;
  
  local_18 = value;
  value_local = (double)this;
  std::make_shared<msgpack11::MsgPackDouble,double&>((double *)&local_28);
  std::shared_ptr<msgpack11::MsgPackValue>::shared_ptr<msgpack11::MsgPackDouble,void>
            (&this->m_ptr,&local_28);
  std::shared_ptr<msgpack11::MsgPackDouble>::~shared_ptr(&local_28);
  return;
}

Assistant:

MsgPack::MsgPack(double value)                     : m_ptr(make_shared<MsgPackDouble>(value)) {}